

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_main.c
# Opt level: O0

int sys_main(int argc,char **argv)

{
  bool bVar1;
  __uid_t _Var2;
  __uid_t _Var3;
  int iVar4;
  char *local_28;
  char *prefsfile;
  int noprefs;
  int i;
  char **argv_local;
  int argc_local;
  
  local_28 = "";
  sys_externalschedlib = 0;
  sys_extraflags = 0;
  _Var2 = getuid();
  _Var3 = geteuid();
  if (_Var2 != _Var3) {
    fprintf(_stderr,"warning: canceling setuid privilege\n");
    _Var2 = getuid();
    setuid(_Var2);
  }
  iVar4 = socket_init();
  if (iVar4 != 0) {
    sys_sockerror("socket_init()");
  }
  pd_init();
  sys_findprogdir(*argv);
  bVar1 = false;
  prefsfile._4_4_ = 0;
  do {
    if (argc <= prefsfile._4_4_) {
      if (!bVar1) {
        sys_loadpreferences(local_28,1);
      }
      iVar4 = sys_argparse(argc + -1,argv + 1);
      if (iVar4 == 0) {
        if ((sys_verbose != 0) || (sys_version != 0)) {
          fprintf(_stderr,"%s compiled %s %s\n",pd_version,pd_compiletime,pd_compiledate);
        }
        if (sys_verbose != 0) {
          fprintf(_stderr,"float precision = %lu bits\n",0x20);
        }
        if (sys_version == 0) {
          sys_setsignalhandlers();
          sys_afterargparse();
          if (sys_dontstartgui == 0) {
            iVar4 = sys_startgui(sys_libdir->s_name);
            if (iVar4 != 0) {
              return 1;
            }
          }
          else {
            sys_fakefromguiclk = clock_new((void *)0x0,sys_fakefromgui);
            clock_set(sys_fakefromguiclk,0.0);
          }
          if (sys_hipriority != 0) {
            sys_setrealtime(sys_libdir->s_name);
          }
          if (sys_externalschedlib == 0) {
            if (sys_batch == 0) {
              sys_reopen_midi();
              iVar4 = audio_shouldkeepopen();
              if (iVar4 != 0) {
                sys_reopen_audio();
              }
              argv_local._4_4_ = m_mainloop();
            }
            else {
              argv_local._4_4_ = m_batchmain();
            }
          }
          else {
            argv_local._4_4_ = sys_run_scheduler(sys_externalschedlibname,sys_extraflagsstring);
          }
        }
        else {
          fflush(_stderr);
          argv_local._4_4_ = 0;
        }
      }
      else {
        argv_local._4_4_ = 1;
      }
      return argv_local._4_4_;
    }
    iVar4 = strcmp(argv[prefsfile._4_4_],"-noprefs");
    if (iVar4 == 0) {
      bVar1 = true;
    }
    else {
      iVar4 = strcmp(argv[prefsfile._4_4_],"-prefsfile");
      if ((iVar4 == 0) && (prefsfile._4_4_ < argc + -1)) {
        local_28 = argv[prefsfile._4_4_ + 1];
      }
      else {
        iVar4 = strcmp(argv[prefsfile._4_4_],"-schedlib");
        if ((iVar4 == 0) && (prefsfile._4_4_ < argc + -1)) {
          sys_externalschedlib = 1;
        }
        else {
          iVar4 = strcmp(argv[prefsfile._4_4_],"-h");
          if ((iVar4 == 0) || (iVar4 = strcmp(argv[prefsfile._4_4_],"-help"), iVar4 == 0)) {
            sys_printusage();
            return 1;
          }
        }
      }
    }
    prefsfile._4_4_ = prefsfile._4_4_ + 1;
  } while( true );
}

Assistant:

int sys_main(int argc, const char **argv)
{
    int i, noprefs;
    const char *prefsfile = "";
    sys_externalschedlib = 0;
    sys_extraflags = 0;
#ifdef PD_DEBUG
    fprintf(stderr, "Pd: COMPILED FOR DEBUGGING\n");
#endif
    /* use Win32 "binary" mode by default since we don't want the
     * translation that Win32 does by default */
#ifdef _WIN32
# ifdef _MSC_VER /* MS Visual Studio */
    _set_fmode( _O_BINARY );
# else  /* MinGW */
    {
#ifndef _fmode
        extern int _fmode;
#endif
        _fmode = _O_BINARY;
    }
# endif /* _MSC_VER */
#endif  /* _WIN32 */
#ifndef _WIN32
    /* long ago Pd used setuid to promote itself to real-time priority.
    Just in case anyone's installation script still makes it setuid, we
    complain to stderr and lose setuid here. */
    if (getuid() != geteuid())
    {
        fprintf(stderr, "warning: canceling setuid privilege\n");
        setuid(getuid());
    }
#endif  /* _WIN32 */
    if (socket_init())
        sys_sockerror("socket_init()");
    pd_init();                                  /* start the message system */
    sys_findprogdir(argv[0]);                   /* set sys_progname, guipath */
    for (i = noprefs = 0; i < argc; i++)    /* prescan ... */
    {
        /* for prefs override */
        if (!strcmp(argv[i], "-noprefs"))
            noprefs = 1;
        else if (!strcmp(argv[i], "-prefsfile") && i < argc-1)
            prefsfile = argv[i+1];
        /* for external scheduler (to ignore audio api in sys_loadpreferences) */
        else if (!strcmp(argv[i], "-schedlib") && i < argc-1)
            sys_externalschedlib = 1;
        else if (!strcmp(argv[i], "-h") || !strcmp(argv[i], "-help"))
        {
            sys_printusage();
            return (1);
        }
    }
    if (!noprefs)       /* load preferences before parsing args to allow ... */
        sys_loadpreferences(prefsfile, 1);  /* args to override prefs */
    if (sys_argparse(argc-1, argv+1))           /* parse cmd line args */
        return (1);
    if (sys_verbose || sys_version) fprintf(stderr, "%s compiled %s %s\n",
        pd_version, pd_compiletime, pd_compiledate);
    if (sys_verbose)
        fprintf(stderr, "float precision = %lu bits\n", sizeof(t_float)*8);
    if (sys_version)    /* if we were just asked our version, exit here. */
    {
        fflush(stderr);
        return (0);
    }
    sys_setsignalhandlers();
    sys_afterargparse();                    /* post-argparse settings */
    if (sys_dontstartgui)
        clock_set((sys_fakefromguiclk =
            clock_new(0, (t_method)sys_fakefromgui)), 0);
    else if (sys_startgui(sys_libdir->s_name)) /* start the gui */
        return (1);
    if (sys_hipriority)
        sys_setrealtime(sys_libdir->s_name); /* set desired process priority */
    if (sys_externalschedlib)
        return (sys_run_scheduler(sys_externalschedlibname,
            sys_extraflagsstring));
    else if (sys_batch)
        return (m_batchmain());
    else
    {
            /* open audio and MIDI */
        sys_reopen_midi();
        if (audio_shouldkeepopen())
            sys_reopen_audio();
            /* run scheduler until it quits */
        return (m_mainloop());
    }
}